

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doPrintValue
               (FloatFormat *fmt,Matrix<float,_3,_2> *value,ostream *os)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  
  __s = glu::getDataTypeName(TYPE_FLOAT_MAT2X3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  lVar2 = 0;
  do {
    if (lVar2 == 0xc) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doPrintValue
              (fmt,(Vector<float,_3> *)((long)(value->m_data).m_data[0].m_data + lVar2),os);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 == 0xc);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintValue	(const FloatFormat& fmt, const T& value, ostream& os)
	{
		os << dataTypeNameOf<T>() << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printValue<Element>(fmt, value[ndx], os);
		}

		os << ")";
	}